

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn_SET_OF.c
# Opt level: O1

int asn_set_add(void *asn_set_of_x,void *ptr)

{
  int iVar1;
  int *piVar2;
  void *pvVar3;
  int iVar4;
  
  if (asn_set_of_x == (void *)0x0 || ptr == (void *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
LAB_00141c23:
    iVar1 = -1;
  }
  else {
    iVar1 = *(int *)((long)asn_set_of_x + 0xc);
    if (*(int *)((long)asn_set_of_x + 8) == iVar1) {
      iVar4 = 4;
      if (iVar1 != 0) {
        iVar4 = iVar1 * 2;
      }
      pvVar3 = realloc(*asn_set_of_x,(long)iVar4 << 3);
      if (pvVar3 == (void *)0x0) goto LAB_00141c23;
      *(void **)asn_set_of_x = pvVar3;
      *(int *)((long)asn_set_of_x + 0xc) = iVar4;
    }
    iVar1 = *(int *)((long)asn_set_of_x + 8);
    *(int *)((long)asn_set_of_x + 8) = iVar1 + 1;
    *(void **)(*asn_set_of_x + (long)iVar1 * 8) = ptr;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
asn_set_add(void *asn_set_of_x, void *ptr) {
	asn_anonymous_set_ *as = _A_SET_FROM_VOID(asn_set_of_x);

	if(as == 0 || ptr == 0) {
		errno = EINVAL;		/* Invalid arguments */
		return -1;
	}

	/*
	 * Make sure there's enough space to insert an element.
	 */
	if(as->count == as->size) {
		int _newsize = as->size ? (as->size << 1) : 4;
		void *_new_arr;
		_new_arr = REALLOC(as->array, _newsize * sizeof(as->array[0]));
		if(_new_arr) {
			as->array = (void **)_new_arr;
			as->size = _newsize;
		} else {
			/* ENOMEM */
			return -1;
		}
	}

	as->array[as->count++] = ptr;

	return 0;
}